

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

int hexstring2data(char *arg,uchar *data,int maxdlen)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  
  sVar2 = strlen(arg);
  iVar7 = (int)sVar2;
  if (maxdlen * 2 < iVar7 || ((sVar2 & 1) != 0 || iVar7 == 0)) {
LAB_00102ea4:
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    memset(data,0,(long)maxdlen);
    if (0 < iVar7 >> 1) {
      uVar3 = 0;
      do {
        cVar1 = arg[uVar3 * 2];
        bVar5 = cVar1 - 0x30;
        if (9 < bVar5) {
          if ((byte)(cVar1 + 0xbfU) < 6) {
            bVar5 = cVar1 - 0x37;
          }
          else {
            bVar5 = cVar1 + 0xa9;
            if (5 < (byte)(cVar1 + 0x9fU)) {
              bVar5 = 0x10;
            }
          }
        }
        if (0xf < bVar5) goto LAB_00102ea4;
        data[uVar3] = bVar5 << 4;
        cVar1 = arg[uVar3 * 2 + 1];
        bVar6 = cVar1 - 0x30;
        if (9 < bVar6) {
          if ((byte)(cVar1 + 0xbfU) < 6) {
            bVar6 = cVar1 - 0x37;
          }
          else {
            bVar6 = cVar1 + 0xa9;
            if (5 < (byte)(cVar1 + 0x9fU)) {
              bVar6 = 0x10;
            }
          }
        }
        if (0xf < bVar6) goto LAB_00102ea4;
        data[uVar3] = bVar6 | bVar5 << 4;
        uVar3 = uVar3 + 1;
      } while ((uint)(iVar7 >> 1) != uVar3);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int hexstring2data(char *arg, unsigned char *data, int maxdlen) {

	int len = strlen(arg);
	int i;
	unsigned char tmp;

	if (!len || len%2 || len > maxdlen*2)
		return 1;

	memset(data, 0, maxdlen);

	for (i=0; i < len/2; i++) {

		tmp = asc2nibble(*(arg+(2*i)));
		if (tmp > 0x0F)
			return 1;

		data[i] = (tmp << 4);

		tmp = asc2nibble(*(arg+(2*i)+1));
		if (tmp > 0x0F)
			return 1;

		data[i] |= tmp;
	}

	return 0;
}